

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_addq(DisasContext_conflict1 *s,TCGv_i64 val,int rlow,int rhigh)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 low;
  TCGv_i32 high;
  TCGv_i64 dest;
  TCGv_i32 tmph;
  TCGv_i32 tmpl;
  TCGv_i64 tmp;
  TCGContext_conflict1 *tcg_ctx;
  int rhigh_local;
  int rlow_local;
  TCGv_i64 val_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  low = load_reg(s,rlow);
  high = load_reg(s,rhigh);
  dest = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_concat_i32_i64_aarch64(tcg_ctx_00,dest,low,high);
  tcg_temp_free_i32(tcg_ctx_00,low);
  tcg_temp_free_i32(tcg_ctx_00,high);
  tcg_gen_add_i64(tcg_ctx_00,val,val,dest);
  tcg_temp_free_i64(tcg_ctx_00,dest);
  return;
}

Assistant:

static void gen_addq(DisasContext *s, TCGv_i64 val, int rlow, int rhigh)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tmp;
    TCGv_i32 tmpl;
    TCGv_i32 tmph;

    /* Load 64-bit value rd:rn.  */
    tmpl = load_reg(s, rlow);
    tmph = load_reg(s, rhigh);
    tmp = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_concat_i32_i64(tcg_ctx, tmp, tmpl, tmph);
    tcg_temp_free_i32(tcg_ctx, tmpl);
    tcg_temp_free_i32(tcg_ctx, tmph);
    tcg_gen_add_i64(tcg_ctx, val, val, tmp);
    tcg_temp_free_i64(tcg_ctx, tmp);
}